

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall
soul::heart::Assignment::Assignment
          (Assignment *this,CodeLocation *l,pool_ptr<soul::heart::Expression> *dest)

{
  CodeLocation local_28;
  
  local_28.sourceCode.object = (l->sourceCode).object;
  local_28.location.data = (l->location).data;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  Statement::Statement(&this->super_Statement,&local_28);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.sourceCode.object);
  (this->super_Statement).super_Object._vptr_Object = (_func_int **)&PTR__Assignment_002d0378;
  (this->target).object = dest->object;
  return;
}

Assistant:

Assignment (CodeLocation l, pool_ptr<Expression> dest)  : Statement (std::move (l)), target (dest)  {}